

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O3

_Bool trans_fcvt_l_s(DisasContext_conflict12 *ctx,arg_fcvt_l_s *a)

{
  TCGContext_conflict11 *s;
  _Bool _Var1;
  TCGTemp *ret;
  uintptr_t o;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  
  if (ctx->mstatus_fs != 0) {
    if ((ctx->misa & 0x20) == 0) {
      _Var1 = false;
    }
    else {
      s = ctx->uc->tcg_ctx;
      ret = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
      gen_set_rm(ctx,a->rm);
      local_38 = (TCGTemp *)(s->cpu_env + (long)s);
      local_30 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_fpr[a->rs1]);
      tcg_gen_callN_riscv64(s,helper_fcvt_l_s_riscv64,ret,2,&local_38);
      if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != (TCGv_i64)((long)ret - (long)s))) {
        tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,
                            (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[a->rd]),(TCGArg)ret);
      }
      tcg_temp_free_internal_riscv64(s,ret);
      _Var1 = true;
    }
    return _Var1;
  }
  return false;
}

Assistant:

static bool trans_fcvt_l_s(DisasContext *ctx, arg_fcvt_l_s *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_set_rm(ctx, a->rm);
    gen_helper_fcvt_l_s(tcg_ctx, t0, tcg_ctx->cpu_env, tcg_ctx->cpu_fpr[a->rs1]);
    gen_set_gpr(tcg_ctx, a->rd, t0);
    tcg_temp_free(tcg_ctx, t0);
    return true;
}